

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall
front::syntax::SyntaxAnalyze::hp_gn_binary_mir
          (SyntaxAnalyze *this,string *tmpName,SharedExNdPtr *first,SharedExNdPtr *second,Op op)

{
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  long in_RDI;
  Op in_stack_00000074;
  RightVal *in_stack_00000078;
  RightVal *in_stack_00000080;
  LeftVal *in_stack_00000088;
  irGenerator *in_stack_00000090;
  RightVal op2;
  RightVal op1;
  int *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff30;
  
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2a5e98);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x2a5ea5);
  peVar1 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a5eaf);
  if (peVar1->_type == CNS) {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a5ebe);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>(in_RSI,in_stack_fffffffffffffed8);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a5ef9);
    std::variant<int,int,std::__cxx11::string>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  peVar1 = std::
           __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a5f1b);
  if (peVar1->_type == CNS) {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a5f2a);
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>(in_RSI,in_stack_fffffffffffffed8);
  }
  else {
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a5f4c);
    std::variant<int,int,std::__cxx11::string>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  __t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x80);
  std::variant<int,std::__cxx11::string>::
  variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
            ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RSI,__t);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant(in_RSI,(variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__t);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant(in_RSI,(variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__t);
  irGenerator::irGenerator::ir_op
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000074);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2a5fd6);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2a5fe0);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x2a5fea);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2a5ff7);
  std::
  variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x2a6004);
  return;
}

Assistant:

void SyntaxAnalyze::hp_gn_binary_mir(string tmpName, SharedExNdPtr first,
                                     SharedExNdPtr second, Op op) {
  RightVal op1;
  RightVal op2;

  if (first->_type == NodeType::CNS) {
    op1.emplace<0>(first->_value);
  } else {
    op1 = first->_name;
  }
  if (second->_type == NodeType::CNS) {
    op2.emplace<0>(second->_value);
  } else {
    op2 = second->_name;
  }
  irGenerator.ir_op(tmpName, op1, op2, op);
}